

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::detail::ContextState::finalizeTestCaseData(ContextState *this)

{
  int *piVar1;
  int iVar2;
  TestCase *pTVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Approx local_58;
  Approx local_38;
  
  dVar4 = Timer::getElapsedSeconds(&this->timer);
  (this->super_CurrentTestCaseStats).seconds = dVar4;
  iVar6 = MultiLaneAtomic::operator_cast_to_int(&this->numAssertsCurrentTest_atomic);
  *(int *)&this->field_0x9c = *(int *)&this->field_0x9c + iVar6;
  iVar6 = MultiLaneAtomic::operator_cast_to_int(&this->numAssertsFailedCurrentTest_atomic);
  *(int *)&this->field_0xa0 = *(int *)&this->field_0xa0 + iVar6;
  iVar6 = MultiLaneAtomic::operator_cast_to_int(&this->numAssertsCurrentTest_atomic);
  (this->super_CurrentTestCaseStats).numAssertsCurrentTest = iVar6;
  iVar6 = MultiLaneAtomic::operator_cast_to_int(&this->numAssertsFailedCurrentTest_atomic);
  (this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = iVar6;
  if (iVar6 != 0) {
    piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  pTVar3 = (this->super_ContextOptions).currentTest;
  dVar4 = (pTVar3->super_TestCaseData).m_timeout;
  local_38.m_epsilon = 2.220446049250313e-16;
  local_38.m_scale = 1.0;
  local_38.m_value = dVar4;
  bVar5 = operator!=(&local_38,0.0);
  if (bVar5) {
    local_58.m_value = (this->super_CurrentTestCaseStats).seconds;
    local_58.m_epsilon = 2.220446049250313e-16;
    local_58.m_scale = 1.0;
    bVar5 = operator>(&local_58,dVar4);
    if (bVar5) {
      piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
      *(byte *)piVar1 = (byte)*piVar1 | 0x10;
    }
  }
  uVar7 = (this->super_CurrentTestCaseStats).failure_flags;
  if ((pTVar3->super_TestCaseData).m_should_fail == true) {
    if (uVar7 == 0) {
      (this->super_CurrentTestCaseStats).failure_flags = 0x20;
      uVar7 = 0x20;
      goto LAB_00110e46;
    }
    uVar8 = 0x40;
LAB_00110e29:
    uVar7 = uVar7 | uVar8;
    (this->super_CurrentTestCaseStats).failure_flags = uVar7;
  }
  else {
    if ((uVar7 != 0) && (uVar8 = 0x200, (pTVar3->super_TestCaseData).m_may_fail != false))
    goto LAB_00110e29;
    iVar2 = (pTVar3->super_TestCaseData).m_expected_failures;
    if (0 < iVar2) {
      uVar8 = (uint)(iVar6 == iVar2) * 0x80 + 0x80;
      goto LAB_00110e29;
    }
  }
  if ((uVar7 & 0x240) != 0) {
    return;
  }
LAB_00110e46:
  if (uVar7 != 0 && (uVar7 & 0x100) == 0) {
    *(int *)&this->field_0x98 = *(int *)&this->field_0x98 + 1;
  }
  return;
}

Assistant:

void finalizeTestCaseData() {
            seconds = timer.getElapsedSeconds();

            // update the non-atomic counters
            numAsserts += numAssertsCurrentTest_atomic;
            numAssertsFailed += numAssertsFailedCurrentTest_atomic;
            numAssertsCurrentTest       = numAssertsCurrentTest_atomic;
            numAssertsFailedCurrentTest = numAssertsFailedCurrentTest_atomic;

            if(numAssertsFailedCurrentTest)
                failure_flags |= TestCaseFailureReason::AssertFailure;

            if(Approx(currentTest->m_timeout).epsilon(DBL_EPSILON) != 0 &&
               Approx(seconds).epsilon(DBL_EPSILON) > currentTest->m_timeout)
                failure_flags |= TestCaseFailureReason::Timeout;

            if(currentTest->m_should_fail) {
                if(failure_flags) {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedAndDid;
                } else {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedButDidnt;
                }
            } else if(failure_flags && currentTest->m_may_fail) {
                failure_flags |= TestCaseFailureReason::CouldHaveFailedAndDid;
            } else if(currentTest->m_expected_failures > 0) {
                if(numAssertsFailedCurrentTest == currentTest->m_expected_failures) {
                    failure_flags |= TestCaseFailureReason::FailedExactlyNumTimes;
                } else {
                    failure_flags |= TestCaseFailureReason::DidntFailExactlyNumTimes;
                }
            }

            bool ok_to_fail = (TestCaseFailureReason::ShouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::CouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::FailedExactlyNumTimes & failure_flags);

            // if any subcase has failed - the whole test case has failed
            if(failure_flags && !ok_to_fail)
                numTestCasesFailed++;
        }